

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

objc_ivar_list * upgradeIvarList(objc_class_gsv1 *cls)

{
  objc_ivar_list_gcc *poVar1;
  objc_ivar_list_gcc type_00;
  bool bVar2;
  BOOL BVar3;
  objc_ivar_ownership o;
  size_t local_60;
  int local_50;
  int size;
  char *type;
  int local_38;
  int j;
  int nextOffset;
  int bitfieldSize;
  BOOL isBitfield;
  int i;
  objc_ivar_list *n;
  objc_ivar_list_gcc *l;
  objc_class_gsv1 *cls_local;
  
  poVar1 = cls->ivars;
  if (poVar1 == (objc_ivar_list_gcc *)0x0) {
    cls_local = (objc_class_gsv1 *)0x0;
  }
  else {
    cls_local = (objc_class_gsv1 *)calloc(1,(long)poVar1->count * 0x20 + 0x10);
    cls_local->super_class = (Class)0x20;
    *(int *)&cls_local->isa = poVar1->count;
    for (bitfieldSize = 0; bitfieldSize < poVar1->count; bitfieldSize = bitfieldSize + 1) {
      bVar2 = false;
      j = 0;
      if (bitfieldSize + 1 < poVar1->count) {
        local_38 = poVar1[(long)(bitfieldSize + 1) * 3 + 3].count;
        if (poVar1[(long)bitfieldSize * 3 + 3].count ==
            poVar1[(long)(bitfieldSize + 1) * 3 + 3].count) {
          bVar2 = true;
          for (type._4_4_ = bitfieldSize + 2; type._4_4_ < poVar1->count;
              type._4_4_ = type._4_4_ + 1) {
            if (poVar1[(long)bitfieldSize * 3 + 3].count != poVar1[(long)type._4_4_ * 3 + 3].count)
            {
              j = poVar1[(long)type._4_4_ * 3 + 3].count - poVar1[(long)bitfieldSize * 3 + 3].count;
              break;
            }
          }
          if (j == 0) {
            j = (int)cls->instance_size - poVar1[(long)bitfieldSize * 3 + 3].count;
          }
        }
      }
      else {
        local_38 = (int)cls->instance_size;
      }
      if (local_38 < 0) {
        local_38 = -local_38;
      }
      type_00 = poVar1[(long)bitfieldSize * 3 + 2];
      local_38 = local_38 - poVar1[(long)bitfieldSize * 3 + 3].count;
      (&cls_local->name)[(long)bitfieldSize * 4] = (char *)poVar1[(long)bitfieldSize * 3 + 1];
      (&cls_local->version)[(long)bitfieldSize * 4] = (long)type_00;
      local_50 = local_38;
      if (bVar2) {
        local_50 = j;
      }
      *(int *)(&cls_local->instance_size + (long)bitfieldSize * 4) = local_50;
      BVar3 = objc_test_class_flag_gsv1(cls,objc_class_flag_new_abi_gsv1);
      if (BVar3 == '\0') {
        (&cls_local->info)[(long)bitfieldSize * 4] =
             (unsigned_long)(poVar1 + (long)bitfieldSize * 3 + 3);
      }
      else {
        (&cls_local->info)[(long)bitfieldSize * 4] = (unsigned_long)cls->ivar_offsets[bitfieldSize];
      }
      if ((type_00 == (objc_ivar_list_gcc)0x0) || (*(char *)type_00 == '\0')) {
        local_60 = 8;
      }
      else {
        local_60 = objc_alignof_type((char *)type_00);
      }
      ivarSetAlign((Ivar)(&cls_local->name + (long)bitfieldSize * 4),local_60);
      if (*(char *)type_00 == '\0') {
        ivarSetAlign((Ivar)(&cls_local->name + (long)bitfieldSize * 4),(long)local_38);
      }
      o = ownershipForIvar(cls,bitfieldSize);
      ivarSetOwnership((Ivar)(&cls_local->name + (long)bitfieldSize * 4),o);
    }
  }
  return (objc_ivar_list *)cls_local;
}

Assistant:

static struct objc_ivar_list *upgradeIvarList(struct objc_class_gsv1 *cls)
{
	struct objc_ivar_list_gcc *l = cls->ivars;
	if (l == NULL)
	{
		return NULL;
	}
	struct objc_ivar_list *n = calloc(1, sizeof(struct objc_ivar_list) +
			l->count*sizeof(struct objc_ivar));
	n->size = sizeof(struct objc_ivar);
	n->count = l->count;
	for (int i=0 ; i<l->count ; i++)
	{
		BOOL isBitfield = NO;
		int bitfieldSize = 0;
		int nextOffset;
		// Bitfields have the same offset, but should have their size set to
		// the size of the bitfield.  We calculate the size of the bitfield by
		// looking for the next ivar after the current one that has a different
		// offset.
		if (i+1 < l->count)
		{
			nextOffset = l->ivar_list[i+1].offset;
			if (l->ivar_list[i].offset == l->ivar_list[i+1].offset)
			{
				isBitfield = YES;
				for (int j=i+2 ; j<l->count ; j++)
				{
					if (l->ivar_list[i].offset != l->ivar_list[j].offset)
					{
						bitfieldSize = l->ivar_list[j].offset - l->ivar_list[i].offset;
						break;
					}
				}
				if (bitfieldSize == 0)
				{
					bitfieldSize = cls->instance_size - l->ivar_list[i].offset;
				}
			}
		}
		else
		{
			nextOffset = cls->instance_size;
		}
		if (nextOffset < 0)
		{
			nextOffset = -nextOffset;
		}
		const char *type = l->ivar_list[i].type;
		int size = nextOffset - l->ivar_list[i].offset;
		n->ivar_list[i].name = l->ivar_list[i].name;
		n->ivar_list[i].type = type;
		n->ivar_list[i].size = isBitfield ? bitfieldSize : size;
		if (objc_test_class_flag_gsv1(cls, objc_class_flag_new_abi_gsv1))
		{
			n->ivar_list[i].offset = cls->ivar_offsets[i];
		}
		else
		{
			n->ivar_list[i].offset = &l->ivar_list[i].offset;
		}
		ivarSetAlign(&n->ivar_list[i], ((type == NULL) || type[0] == 0) ? __alignof__(void*) : objc_alignof_type(type));
		if (type[0] == '\0')
		{
			ivarSetAlign(&n->ivar_list[i], size);
		}
		ivarSetOwnership(&n->ivar_list[i], ownershipForIvar(cls, i));
	}
	return n;
}